

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.hpp
# Opt level: O2

MultiFileReaderBindData * __thiscall
duckdb::MultiFileReader::BindUnionReader<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
          (MultiFileReaderBindData *__return_storage_ptr__,MultiFileReader *this,
          ClientContext *context,vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,MultiFileList *files,MultiFileBindData *result,ParquetOptions *options,
          MultiFileOptions *file_options)

{
  reference this_00;
  type union_data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  union_col_names;
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> union_readers;
  vector<duckdb::OpenFileInfo,_true> materialized_file_list;
  MultiFileOptions *in_stack_ffffffffffffff50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  ClientContext *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  local_60;
  
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)names;
  (*files->_vptr_MultiFileList[4])(&stack0xffffffffffffffb8,files);
  local_70 = context;
  UnionByName::UnionCols<duckdb::ParquetMultiFileInfo,duckdb::ParquetOptions>
            ((vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true> *)&local_60,
             (UnionByName *)context,(ClientContext *)&stack0xffffffffffffffb8,
             (vector<duckdb::OpenFileInfo,_true> *)&local_a8,
             (vector<duckdb::LogicalType,_true> *)&local_88,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)options,(ParquetOptions *)file_options,in_stack_ffffffffffffff50);
  ::std::__copy_move<true,false,std::random_access_iterator_tag>::
  __copy_m<duckdb::shared_ptr<duckdb::BaseUnionData,true>*,std::back_insert_iterator<duckdb::vector<duckdb::shared_ptr<duckdb::BaseUnionData,true>,true>>>
            (local_60.
             super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_60.
             super__Vector_base<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (back_insert_iterator<duckdb::vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true>_>
              )&result->union_readers);
  (__return_storage_ptr__->filename_idx).index = 0xffffffffffffffff;
  (__return_storage_ptr__->hive_partitioning_indexes).
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->hive_partitioning_indexes).
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->hive_partitioning_indexes).
  super_vector<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  super__Vector_base<duckdb::HivePartitioningIndex,_std::allocator<duckdb::HivePartitioningIndex>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->schema).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->schema).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->schema).
  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  .
  super__Vector_base<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->mapping = BY_NAME;
  (*this->_vptr_MultiFileReader[8])
            (this,file_options,files,&local_a8,&local_88,__return_storage_ptr__);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(local_68,&local_88);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&return_types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &local_a8);
  this_00 = vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_true>::get<true>
                      (&result->union_readers,0);
  union_data = shared_ptr<duckdb::BaseUnionData,_true>::operator*(this_00);
  MultiFileBindData::Initialize(result,local_70,union_data);
  ::std::
  vector<duckdb::shared_ptr<duckdb::BaseUnionData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::BaseUnionData,_true>_>_>
  ::~vector(&local_60);
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
             &stack0xffffffffffffffb8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

MultiFileReaderBindData BindUnionReader(ClientContext &context, vector<LogicalType> &return_types,
	                                        vector<string> &names, MultiFileList &files, MultiFileBindData &result,
	                                        OPTIONS_TYPE &options, MultiFileOptions &file_options) {
		D_ASSERT(file_options.union_by_name);
		vector<string> union_col_names;
		vector<LogicalType> union_col_types;

		// obtain the set of union column names + types by unifying the types of all of the files
		// note that this requires opening readers for each file and reading the metadata of each file
		// note also that it requires fully expanding the MultiFileList
		auto materialized_file_list = files.GetAllFiles();
		auto union_readers = UnionByName::UnionCols<OP>(context, materialized_file_list, union_col_types,
		                                                union_col_names, options, file_options);

		std::move(union_readers.begin(), union_readers.end(), std::back_inserter(result.union_readers));
		// perform the binding on the obtained set of names + types
		MultiFileReaderBindData bind_data;
		BindOptions(file_options, files, union_col_types, union_col_names, bind_data);
		names = union_col_names;
		return_types = union_col_types;
		result.Initialize(context, *result.union_readers[0]);
		D_ASSERT(names.size() == return_types.size());
		return bind_data;
	}